

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O3

TIFFReadDirEntryErr TIFFReadDirEntryShort(TIFF *tif,TIFFDirEntry *direntry,uint16_t *value)

{
  uint32_t uVar1;
  TIFFReadDirEntryErr TVar2;
  uint uVar3;
  int16_t m;
  undefined8 local_20;
  
  if (direntry->tdir_count != 1) {
    return TIFFReadDirEntryErrCount;
  }
  TVar2 = TIFFReadDirEntryErrType;
  switch(direntry->tdir_type) {
  case 1:
    uVar3 = (uint)*(byte *)&direntry->tdir_offset;
    break;
  default:
    goto switchD_00291a0b_caseD_2;
  case 3:
    uVar1 = tif->tif_flags;
    *value = (direntry->tdir_offset).toff_short;
    if (-1 < (char)uVar1) {
      return TIFFReadDirEntryErrOk;
    }
    TIFFSwabShort(value);
    return TIFFReadDirEntryErrOk;
  case 4:
  case 9:
    uVar3 = (direntry->tdir_offset).toff_long;
    local_20._0_2_ = (ushort)uVar3;
    local_20._2_2_ = (undefined2)(uVar3 >> 0x10);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabLong((uint32_t *)&local_20);
      uVar3 = CONCAT22(local_20._2_2_,(ushort)local_20);
    }
    if (0xffff < uVar3) {
      return TIFFReadDirEntryErrRange;
    }
    break;
  case 6:
    TVar2 = (direntry->tdir_offset).toff_long >> 5 & TIFFReadDirEntryErrRange;
    if (TVar2 != TIFFReadDirEntryErrOk) {
      return TVar2;
    }
    uVar3 = (uint)(char)(direntry->tdir_offset).toff_long;
    break;
  case 8:
    local_20._0_2_ = (direntry->tdir_offset).toff_short;
    if ((char)tif->tif_flags < '\0') {
      TIFFSwabShort((uint16_t *)&local_20);
    }
    TVar2 = (ushort)local_20 >> 0xd & TIFFReadDirEntryErrRange;
    if (((ushort)local_20 >> 0xd & 4) != 0) {
      return TVar2;
    }
    *value = (ushort)local_20;
    return TVar2;
  case 0x10:
    TVar2 = TIFFReadDirEntryCheckedLong8(tif,direntry,&local_20);
    goto LAB_00291a9d;
  case 0x11:
    TVar2 = TIFFReadDirEntryCheckedSlong8(tif,direntry,&local_20);
LAB_00291a9d:
    if (TVar2 != TIFFReadDirEntryErrOk) {
      return TVar2;
    }
    if (0xffff < CONCAT44(local_20._4_4_,CONCAT22(local_20._2_2_,(ushort)local_20))) {
      return TIFFReadDirEntryErrRange;
    }
    *value = (ushort)local_20;
    goto LAB_00291ad3;
  }
  *value = (uint16_t)uVar3;
LAB_00291ad3:
  TVar2 = TIFFReadDirEntryErrOk;
switchD_00291a0b_caseD_2:
  return TVar2;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryShort(TIFF *tif, TIFFDirEntry *direntry, uint16_t *value)
{
    enum TIFFReadDirEntryErr err;
    if (direntry->tdir_count != 1)
        return (TIFFReadDirEntryErrCount);
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t m;
            TIFFReadDirEntryCheckedByte(tif, direntry, &m);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SBYTE:
        {
            int8_t m;
            TIFFReadDirEntryCheckedSbyte(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeShortSbyte(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SHORT:
            TIFFReadDirEntryCheckedShort(tif, direntry, value);
            return (TIFFReadDirEntryErrOk);
        case TIFF_SSHORT:
        {
            int16_t m;
            TIFFReadDirEntryCheckedSshort(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeShortSshort(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_LONG:
        {
            uint32_t m;
            TIFFReadDirEntryCheckedLong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeShortLong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG:
        {
            int32_t m;
            TIFFReadDirEntryCheckedSlong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeShortSlong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_LONG8:
        {
            uint64_t m;
            err = TIFFReadDirEntryCheckedLong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeShortLong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG8:
        {
            int64_t m;
            err = TIFFReadDirEntryCheckedSlong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeShortSlong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        default:
            return (TIFFReadDirEntryErrType);
    }
}